

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O3

void Fraction::Test(void)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Fraction FVar6;
  ulong uVar7;
  _Ct __n2_1;
  _Ct __n2;
  int iVar8;
  uint uVar9;
  string input;
  string output;
  Fraction f;
  istringstream in;
  ostringstream out;
  long *local_388 [2];
  long local_378 [2];
  long *local_368;
  size_t local_360;
  long local_358 [2];
  Fraction local_348;
  size_t local_340;
  long local_338 [2];
  Fraction local_328 [15];
  ios_base local_2b0 [264];
  Fraction local_1a8 [14];
  ios_base local_138 [264];
  
  uVar2 = std::__detail::__gcd<unsigned_int>(0,1);
  uVar3 = 0;
  if (uVar2 + 1 < 3) {
    uVar3 = uVar2;
  }
  if (1e-09 <= ABS(0.0 / (double)(int)uVar3)) {
    __assert_fail("fabs(Fraction(0, 1).ToDouble() - (double) 0) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf6,"static void Fraction::Test()");
  }
  uVar3 = std::__detail::__gcd<unsigned_int>(2,3);
  if (1e-09 <= ABS((double)(int)(2 / (long)(int)uVar3) / (double)(int)(3 / (long)(int)uVar3) +
                   -0.6666666666666666)) {
    __assert_fail("fabs(Fraction(2, 3).ToDouble() - (double) 2 / 3) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf7,"static void Fraction::Test()");
  }
  uVar3 = std::__detail::__gcd<unsigned_int>(7,3);
  if (1e-09 <= ABS((double)(-7 / (int)uVar3) / (double)(int)(3 / (long)(int)uVar3) +
                   2.3333333333333335)) {
    __assert_fail("fabs(Fraction(-7, 3).ToDouble() - (double) (-7) / 3) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf8,"static void Fraction::Test()");
  }
  uVar3 = std::__detail::__gcd<unsigned_int>(5,9);
  if (1e-09 <= ABS((double)(-5 / (int)uVar3) / (double)(int)(9 / (long)(int)uVar3) +
                   0.5555555555555556)) {
    __assert_fail("fabs(Fraction(5, -9).ToDouble() - (double) (-5) / 9) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf9,"static void Fraction::Test()");
  }
  uVar3 = std::__detail::__gcd<unsigned_int>(3,0xb);
  if (1e-09 <= ABS((double)(int)(3 / (long)(int)uVar3) / (double)(int)(0xb / (long)(int)uVar3) +
                   -0.2727272727272727)) {
    __assert_fail("fabs(Fraction(-3, -11).ToDouble() - (double) 3 / 11) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xfa,"static void Fraction::Test()");
  }
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_388,"6/3 0/6 4/6 -7/3 5/-9 -3/-11","");
  local_368 = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"2 0 2/3 -7/3 -5/9 3/11 ","")
  ;
  std::__cxx11::istringstream::istringstream((istringstream *)local_328,(string *)local_388,_S_in);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  iVar8 = 6;
  do {
    local_348.numerator_ = 0;
    local_348.denominator_ = 1;
    operator>>((istream *)local_328,&local_348);
    operator<<((ostream *)local_1a8,&local_348);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  std::__cxx11::stringbuf::str();
  FVar6 = local_348;
  if (local_340 == local_360) {
    if (local_340 != 0) {
      iVar8 = bcmp((void *)local_348,local_368,local_340);
      if (iVar8 != 0) goto LAB_00109608;
    }
    if (FVar6 != (Fraction)local_338) {
      operator_delete((void *)FVar6,local_338[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_328);
    std::ios_base::~ios_base(local_2b0);
    if (local_368 != local_358) {
      operator_delete(local_368,local_358[0] + 1);
    }
    if (local_388[0] != local_378) {
      operator_delete(local_388[0],local_378[0] + 1);
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    local_328[0] = (Fraction)((ulong)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(1,3);
    local_1a8[0].numerator_ = 0;
    if (uVar3 + 1 < 3) {
      local_1a8[0].numerator_ = uVar3;
    }
    local_1a8[0].denominator_ = (int)(3 / (long)(int)uVar3);
    FVar6 = operator+(local_328,local_1a8);
    uVar2 = std::__detail::__gcd<unsigned_int>(1,3);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if ((uVar3 != FVar6.numerator_) || ((int)(3 / (long)(int)uVar2) != FVar6.denominator_)) {
      __assert_fail("Fraction(0, 1) + Fraction(1, 3) == Fraction(1, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x110,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0].denominator_ = (int)(2 / (long)(int)uVar3);
    local_328[0].numerator_ = -5 / (int)uVar3;
    uVar3 = std::__detail::__gcd<unsigned_int>(6,5);
    local_1a8[0].numerator_ = (int)(6 / (long)(int)uVar3);
    local_1a8[0].denominator_ = (int)(5 / (long)(int)uVar3);
    FVar6 = operator+(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(0xd,10);
    if ((-0xd / (int)uVar3 != FVar6.numerator_) ||
       ((int)(10 / (long)(int)uVar3) != FVar6.denominator_)) {
      __assert_fail("Fraction(-5, 2) + Fraction(6, 5) == Fraction(-13, 10)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x111,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0].denominator_ = (int)(2 / (long)(int)uVar3);
    local_328[0].numerator_ = -5 / (int)uVar3;
    local_1a8[0].denominator_ = std::__detail::__gcd<unsigned_int>(0,1);
    local_1a8[0].numerator_ = 0;
    if (2 < local_1a8[0].denominator_ + 1U) {
      local_1a8[0].denominator_ = 0;
    }
    FVar6 = ::operator-(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    if ((-5 / (int)uVar3 != FVar6.numerator_) || ((int)(2 / (long)(int)uVar3) != FVar6.denominator_)
       ) {
      __assert_fail("Fraction(-5, 2) - Fraction(0, 1) == Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x112,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(3,7);
    local_328[0].denominator_ = (int)(7 / (long)(int)uVar3);
    local_328[0].numerator_ = (int)(3 / (long)(int)uVar3);
    uVar3 = std::__detail::__gcd<unsigned_int>(6,0x19);
    local_1a8[0].numerator_ = -6 / (int)uVar3;
    local_1a8[0].denominator_ = (int)(0x19 / (long)(int)uVar3);
    FVar6 = ::operator-(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(0x75,0xaf);
    if (((int)(0x75 / (long)(int)uVar3) != FVar6.numerator_) ||
       ((int)(0xaf / (long)(int)uVar3) != FVar6.denominator_)) {
      __assert_fail("Fraction(3, 7) - Fraction(-6, 25) == Fraction(117, 175)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x113,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = std::__detail::__gcd<unsigned_int>(0,5);
    uVar3 = (int)(5 / (long)(int)uVar2) * (int)(2 / (long)(int)uVar3);
    if ((int)uVar3 < 1) {
      uVar3 = -uVar3;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(0,uVar3);
    uVar4 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar4 + 1) {
      uVar4 = 0;
    }
    if ((int)uVar3 / (int)uVar2 != uVar4) {
      __assert_fail("Fraction(-5, 2) * Fraction(0, 5) == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x114,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = std::__detail::__gcd<unsigned_int>(2,5);
    uVar4 = (-2 / (int)uVar2) * (-5 / (int)uVar3);
    uVar2 = (int)(5 / (long)(int)uVar2) * (int)(2 / (long)(int)uVar3);
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar5 = uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = -uVar4;
    }
    uVar9 = -uVar4;
    if (-1 < (int)uVar2) {
      uVar9 = uVar4;
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(uVar5,uVar3);
    uVar5 = std::__detail::__gcd<unsigned_int>(1,1);
    uVar2 = 0;
    if (uVar5 + 1 < 3) {
      uVar2 = uVar5;
    }
    if (((int)uVar9 / (int)uVar4 != uVar2) || ((int)uVar3 / (int)uVar4 != uVar2)) {
      __assert_fail("Fraction(-5, 2) * Fraction(-2, 5) == Fraction(1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x115,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    local_328[0] = (Fraction)((ulong)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(2,5);
    local_1a8[0].numerator_ = (int)(2 / (long)(int)uVar3);
    local_1a8[0].denominator_ = (int)(5 / (long)(int)uVar3);
    FVar6 = operator/(local_328,local_1a8);
    uVar2 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if ((FVar6.numerator_ != 0) || (uVar3 != FVar6.denominator_)) {
      __assert_fail("Fraction(0, 1) / Fraction(2, 5) == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x116,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0].denominator_ = (int)(2 / (long)(int)uVar3);
    local_328[0].numerator_ = -5 / (int)uVar3;
    uVar3 = std::__detail::__gcd<unsigned_int>(2,5);
    local_1a8[0].numerator_ = (int)(2 / (long)(int)uVar3);
    local_1a8[0].denominator_ = (int)(5 / (long)(int)uVar3);
    FVar6 = operator/(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(0x19,4);
    if ((-0x19 / (int)uVar3 != FVar6.numerator_) ||
       ((int)(4 / (long)(int)uVar3) != FVar6.denominator_)) {
      __assert_fail("Fraction(-5, 2) / Fraction(2, 5) == Fraction(-25, 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x117,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(1,3);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    uVar5 = std::__detail::__gcd<unsigned_int>(1,3);
    uVar4 = 0;
    if (uVar5 + 1 < 3) {
      uVar4 = uVar5;
    }
    if (((int)(3 / (long)(int)uVar2) != (int)(3 / (long)(int)uVar5)) || (uVar3 != uVar4)) {
      __assert_fail("Fraction(1, 3) == Fraction(1, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x11a,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(4,2);
    uVar4 = std::__detail::__gcd<unsigned_int>(2,1);
    uVar3 = 0;
    if (uVar4 + 1 < 3) {
      uVar3 = uVar4;
    }
    if (((int)(4 / (long)(int)uVar2) != (int)(2 / (long)(int)uVar4)) ||
       ((uint)(2 / (long)(int)uVar2) != uVar3)) {
      __assert_fail("Fraction(4, 2) == Fraction(2, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x11b,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = std::__detail::__gcd<unsigned_int>(6,5);
    if ((-5 / (int)uVar3 == (int)(6 / (long)(int)uVar2)) &&
       ((int)(2 / (long)(int)uVar3) == (int)(5 / (long)(int)uVar2))) {
      __assert_fail("Fraction(-5, 2) != Fraction(6, 5)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x11c,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = std::__detail::__gcd<unsigned_int>(0xb,4);
    if (((int)(5 / (long)(int)uVar3) == (int)(0xb / (long)(int)uVar2)) &&
       ((int)(2 / (long)(int)uVar3) == (int)(4 / (long)(int)uVar2))) {
      __assert_fail("Fraction(5, 2) != Fraction(11, 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x11d,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar4 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar4 + 1 < 3) {
      uVar3 = uVar4;
    }
    if (-1 < (int)(uVar3 * (-5 / (int)uVar2))) {
      __assert_fail("Fraction(-5, 2) < Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x11e,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(3,5);
    uVar2 = std::__detail::__gcd<unsigned_int>(2,3);
    if ((int)(2 / (long)(int)uVar2) * (int)(5 / (long)(int)uVar3) <=
        (int)(3 / (long)(int)uVar2) * (int)(3 / (long)(int)uVar3)) {
      __assert_fail("Fraction(3, 5) < Fraction(2, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x11f,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(3,7);
    uVar2 = std::__detail::__gcd<unsigned_int>(6,0x19);
    if ((int)(0x19 / (long)(int)uVar2) * (int)(3 / (long)(int)uVar3) <=
        (-6 / (int)uVar2) * (int)(7 / (long)(int)uVar3)) {
      __assert_fail("Fraction(3, 7) > Fraction(-6, 25)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x120,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar4 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar4 + 1 < 3) {
      uVar3 = uVar4;
    }
    if ((int)(uVar3 * (int)(5 / (long)(int)uVar2)) < 1) {
      __assert_fail("Fraction(5, 2) > Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x121,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(1,2);
    uVar4 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar4 + 1 < 3) {
      uVar3 = uVar4;
    }
    if (0 < (int)(uVar3 * (-1 / (int)uVar2))) {
      __assert_fail("Fraction(-1, 2) <= Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x122,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(1,2);
    uVar2 = std::__detail::__gcd<unsigned_int>(4,8);
    if ((-4 / (int)uVar2) * (int)(2 / (long)(int)uVar3) <
        (int)(8 / (long)(int)uVar2) * (-1 / (int)uVar3)) {
      __assert_fail("Fraction(-1, 2) <= Fraction(-4, 8)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x123,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(2,5);
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    if ((int)(2 / (long)(int)uVar2) * (-2 / (int)uVar3) <
        (-5 / (int)uVar2) * (int)(5 / (long)(int)uVar3)) {
      __assert_fail("Fraction(-2, 5) >= Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x124,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(10,4);
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    if ((int)(2 / (long)(int)uVar2) * (-10 / (int)uVar3) <
        (-5 / (int)uVar2) * (int)(4 / (long)(int)uVar3)) {
      __assert_fail("Fraction(-10, 4) >= Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x125,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    if ((int)uVar3 < 1) {
      uVar3 = -uVar3;
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(uVar3,uVar3);
    uVar5 = std::__detail::__gcd<unsigned_int>(1,1);
    uVar2 = 0;
    if (uVar5 + 1 < 3) {
      uVar2 = uVar5;
    }
    if ((int)uVar3 / (int)uVar4 != uVar2) {
      __assert_fail("Fraction(0, 1) + 1 == Fraction(1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x128,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar3 = (uint)(2 / (long)(int)uVar2);
    uVar4 = uVar3 * 5 + -5 / (int)uVar2;
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    uVar5 = uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = -uVar4;
    }
    uVar9 = -uVar4;
    if (-1 < (int)uVar3) {
      uVar9 = uVar4;
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(uVar5,uVar2);
    uVar4 = std::__detail::__gcd<unsigned_int>(5,2);
    if (((int)uVar9 / (int)uVar3 != (int)(5 / (long)(int)uVar4)) ||
       ((int)uVar2 / (int)uVar3 != (int)(2 / (long)(int)uVar4))) {
      __assert_fail("Fraction(-5, 2) + 5 == Fraction(5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x129,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = -5 / (int)uVar3;
    uVar4 = (uint)(2 / (long)(int)uVar3);
    uVar3 = -uVar4;
    if (0 < (int)uVar4) {
      uVar3 = uVar4;
    }
    uVar5 = uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = -uVar2;
    }
    uVar9 = -uVar2;
    if (-1 < (int)uVar4) {
      uVar9 = uVar2;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(uVar5,uVar3);
    uVar4 = std::__detail::__gcd<unsigned_int>(5,2);
    if (((int)uVar9 / (int)uVar2 != -5 / (int)uVar4) ||
       ((int)uVar3 / (int)uVar2 != (int)(2 / (long)(int)uVar4))) {
      __assert_fail("Fraction(-5, 2) - 0 == Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x12a,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(3,7);
    uVar2 = (uint)(7 / (long)(int)uVar3);
    uVar4 = uVar2 * -0x19 + (int)(3 / (long)(int)uVar3);
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar5 = uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = -uVar4;
    }
    uVar9 = -uVar4;
    if (-1 < (int)uVar2) {
      uVar9 = uVar4;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(uVar5,uVar3);
    uVar4 = std::__detail::__gcd<unsigned_int>(0xac,7);
    if (((int)uVar9 / (int)uVar2 != -0xac / (int)uVar4) ||
       ((int)uVar3 / (int)uVar2 != (int)(7 / (long)(int)uVar4))) {
      __assert_fail("Fraction(3, 7) - 25 == Fraction(-172, 7)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,299,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar3 = (uint)(2 / (long)(int)uVar3);
    if ((int)uVar3 < 1) {
      uVar3 = -uVar3;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(0,uVar3);
    uVar4 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar4 + 1) {
      uVar4 = 0;
    }
    if ((int)uVar3 / (int)uVar2 != uVar4) {
      __assert_fail("Fraction(-5, 2) * 0 == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,300,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar3 = (-5 / (int)uVar2) * 2;
    uVar5 = (-5 / (int)uVar2) * -2;
    uVar4 = (uint)(2 / (long)(int)uVar2);
    uVar2 = -uVar4;
    if (0 < (int)uVar4) {
      uVar2 = uVar4;
    }
    uVar9 = uVar3;
    if (-1 < (int)uVar4) {
      uVar9 = uVar5;
    }
    if ((int)uVar3 < 0) {
      uVar3 = uVar5;
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(uVar3,uVar2);
    uVar5 = std::__detail::__gcd<unsigned_int>(5,1);
    uVar3 = 0;
    if (uVar5 + 1 < 3) {
      uVar3 = uVar5;
    }
    if (((int)uVar9 / (int)uVar4 != (int)(5 / (long)(int)uVar5)) ||
       ((int)uVar2 / (int)uVar4 != uVar3)) {
      __assert_fail("Fraction(-5, 2) * (-2) == Fraction(5, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x12d,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    local_328[0] = (Fraction)((ulong)uVar3 << 0x20);
    local_1a8[0].numerator_ = 5;
    FVar6 = operator/(local_328,&local_1a8[0].numerator_);
    uVar2 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if ((FVar6.numerator_ != 0) || (uVar3 != FVar6.denominator_)) {
      __assert_fail("Fraction(0, 1) / 5 == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x12e,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0].denominator_ = (int)(2 / (long)(int)uVar3);
    local_328[0].numerator_ = -5 / (int)uVar3;
    local_1a8[0].numerator_ = 2;
    FVar6 = operator/(local_328,&local_1a8[0].numerator_);
    uVar3 = std::__detail::__gcd<unsigned_int>(5,4);
    if ((-5 / (int)uVar3 != FVar6.numerator_) || ((int)(4 / (long)(int)uVar3) != FVar6.denominator_)
       ) {
      __assert_fail("Fraction(-5, 2) / 2 == Fraction(-5, 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x12f,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    uVar2 = uVar3 * 3;
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    uVar5 = uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar3 * -3;
    }
    uVar9 = uVar3 * -3;
    if (-1 < (int)uVar3) {
      uVar9 = uVar2;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(uVar5,uVar4);
    uVar5 = std::__detail::__gcd<unsigned_int>(3,1);
    uVar3 = 0;
    if (uVar5 + 1 < 3) {
      uVar3 = uVar5;
    }
    if (((int)uVar9 / (int)uVar2 != (int)(3 / (long)(int)uVar5)) ||
       ((int)uVar4 / (int)uVar2 != uVar3)) {
      __assert_fail("3 + Fraction(0, 1) == Fraction(3, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x132,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = (uint)(2 / (long)(int)uVar3);
    uVar3 = -5 / (int)uVar3 + uVar2 * 6;
    uVar4 = -uVar2;
    if (0 < (int)uVar2) {
      uVar4 = uVar2;
    }
    uVar5 = uVar3;
    if ((int)uVar3 < 1) {
      uVar5 = -uVar3;
    }
    uVar9 = -uVar3;
    if (-1 < (int)uVar2) {
      uVar9 = uVar3;
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(uVar5,uVar4);
    uVar2 = std::__detail::__gcd<unsigned_int>(7,2);
    if (((int)uVar9 / (int)uVar3 != (int)(7 / (long)(int)uVar2)) ||
       ((int)uVar4 / (int)uVar3 != (int)(2 / (long)(int)uVar2))) {
      __assert_fail("6 + Fraction(-5, 2) == Fraction(7, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x133,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = (uint)(2 / (long)(int)uVar3);
    uVar4 = uVar2 - -5 / (int)uVar3;
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar5 = uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = -uVar4;
    }
    uVar9 = -uVar4;
    if (-1 < (int)uVar2) {
      uVar9 = uVar4;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(uVar5,uVar3);
    uVar4 = std::__detail::__gcd<unsigned_int>(7,2);
    if (((int)uVar9 / (int)uVar2 != (int)(7 / (long)(int)uVar4)) ||
       ((int)uVar3 / (int)uVar2 != (int)(2 / (long)(int)uVar4))) {
      __assert_fail("1 - Fraction(-5, 2) == Fraction(7, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x134,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(3,7);
    uVar3 = (uint)(7 / (long)(int)uVar2);
    uVar4 = uVar3 * 0x19 - (int)(3 / (long)(int)uVar2);
    uVar2 = -uVar3;
    if (0 < (int)uVar3) {
      uVar2 = uVar3;
    }
    uVar5 = uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = -uVar4;
    }
    uVar9 = -uVar4;
    if (-1 < (int)uVar3) {
      uVar9 = uVar4;
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(uVar5,uVar2);
    uVar4 = std::__detail::__gcd<unsigned_int>(0xac,7);
    if (((int)uVar9 / (int)uVar3 != (int)(0xac / (long)(int)uVar4)) ||
       ((int)uVar2 / (int)uVar3 != (int)(7 / (long)(int)uVar4))) {
      __assert_fail("25 - Fraction(3, 7) == Fraction(172, 7)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x135,"static void Fraction::Test()");
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar3 = (-5 / (int)uVar4) * 5;
    uVar5 = (uint)(2 / (long)(int)uVar4);
    uVar2 = -uVar5;
    if (0 < (int)uVar5) {
      uVar2 = uVar5;
    }
    uVar4 = (-5 / (int)uVar4) * -5;
    uVar9 = uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar4;
    }
    if (-1 < (int)uVar5) {
      uVar4 = uVar3;
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(uVar9,uVar2);
    uVar5 = std::__detail::__gcd<unsigned_int>(0x19,2);
    if (((int)uVar4 / (int)uVar3 != -0x19 / (int)uVar5) ||
       ((int)uVar2 / (int)uVar3 != (int)(2 / (long)(int)uVar5))) {
      __assert_fail("5 * Fraction(-5, 2) == Fraction(-25, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x136,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar3 = (-5 / (int)uVar2) * 5;
    uVar5 = (-5 / (int)uVar2) * -5;
    uVar4 = (uint)(2 / (long)(int)uVar2);
    uVar2 = -uVar4;
    if (0 < (int)uVar4) {
      uVar2 = uVar4;
    }
    uVar9 = uVar3;
    if (-1 < (int)uVar4) {
      uVar9 = uVar5;
    }
    if ((int)uVar3 < 0) {
      uVar3 = uVar5;
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(uVar3,uVar2);
    uVar4 = std::__detail::__gcd<unsigned_int>(0x19,2);
    if (((int)uVar9 / (int)uVar3 != (int)(0x19 / (long)(int)uVar4)) ||
       ((int)uVar2 / (int)uVar3 != (int)(2 / (long)(int)uVar4))) {
      __assert_fail("(-5) * Fraction(-5, 2) == Fraction(25, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x137,"static void Fraction::Test()");
    }
    local_1a8[0].numerator_ = 2;
    local_328[0].denominator_ = std::__detail::__gcd<unsigned_int>(1,1);
    if (2 < local_328[0].denominator_ + 1U) {
      local_328[0].denominator_ = 0;
    }
    local_328[0].numerator_ = local_328[0].denominator_;
    FVar6 = operator/(&local_1a8[0].numerator_,local_328);
    uVar2 = std::__detail::__gcd<unsigned_int>(2,1);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if (((int)(2 / (long)(int)uVar2) != FVar6.numerator_) || (uVar3 != FVar6.denominator_)) {
      __assert_fail("2 / Fraction(1, 1) == Fraction(2, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x138,"static void Fraction::Test()");
    }
    local_1a8[0].numerator_ = 2;
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0].denominator_ = (int)(2 / (long)(int)uVar3);
    local_328[0].numerator_ = -5 / (int)uVar3;
    FVar6 = operator/(&local_1a8[0].numerator_,local_328);
    uVar3 = std::__detail::__gcd<unsigned_int>(4,5);
    if ((-4 / (int)uVar3 != FVar6.numerator_) || ((int)(5 / (long)(int)uVar3) != FVar6.denominator_)
       ) {
      __assert_fail("2 / Fraction(-5, 2) == Fraction(-4, 5)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x139,"static void Fraction::Test()");
    }
    local_328[0].numerator_ = 0;
    local_328[0].denominator_ = 1;
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    local_328[0] = (Fraction)((ulong)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(1,3);
    local_1a8[0].numerator_ = 0;
    if (uVar3 + 1 < 3) {
      local_1a8[0].numerator_ = uVar3;
    }
    local_1a8[0].denominator_ = (int)(3 / (long)(int)uVar3);
    operator+=(local_328,local_1a8);
    uVar2 = std::__detail::__gcd<unsigned_int>(1,3);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if ((local_328[0].numerator_ != uVar3) ||
       (local_328[0].denominator_ != (int)(3 / (long)(int)uVar2))) {
      __assert_fail("a == Fraction(1, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x13f,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0] = (Fraction)((ulong)(uint)(-5 / (int)uVar3) | 2 / (long)(int)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(6,5);
    local_1a8[0].numerator_ = (int)(6 / (long)(int)uVar3);
    local_1a8[0].denominator_ = (int)(5 / (long)(int)uVar3);
    operator+=(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(0xd,10);
    if ((local_328[0].numerator_ != -0xd / (int)uVar3) ||
       (local_328[0].denominator_ != (int)(10 / (long)(int)uVar3))) {
      __assert_fail("a == Fraction(-13, 10)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x143,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0] = (Fraction)((ulong)(uint)(-5 / (int)uVar3) | 2 / (long)(int)uVar3 << 0x20);
    local_1a8[0].denominator_ = std::__detail::__gcd<unsigned_int>(0,1);
    local_1a8[0].numerator_ = 0;
    if (2 < local_1a8[0].denominator_ + 1U) {
      local_1a8[0].denominator_ = 0;
    }
    operator-=(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    if ((local_328[0].numerator_ != -5 / (int)uVar3) ||
       (local_328[0].denominator_ != (int)(2 / (long)(int)uVar3))) {
      __assert_fail("a == Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x147,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(3,7);
    local_328[0] = (Fraction)(3 / (long)(int)uVar3 & 0xffffffffU | 7 / (long)(int)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(6,0x19);
    local_1a8[0].numerator_ = -6 / (int)uVar3;
    local_1a8[0].denominator_ = (int)(0x19 / (long)(int)uVar3);
    operator-=(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(0x75,0xaf);
    if ((local_328[0].numerator_ != (int)(0x75 / (long)(int)uVar3)) ||
       (local_328[0].denominator_ != (int)(0xaf / (long)(int)uVar3))) {
      __assert_fail("a == Fraction(117, 175)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x14b,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0] = (Fraction)((ulong)(uint)(-5 / (int)uVar3) | 2 / (long)(int)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(0,5);
    uVar3 = (int)(5 / (long)(int)uVar3) * local_328[0].denominator_;
    local_328[0].denominator_ = -uVar3;
    if (0 < (int)uVar3) {
      local_328[0].denominator_ = uVar3;
    }
    local_328[0].numerator_ = 0;
    uVar3 = std::__detail::__gcd<unsigned_int>(0,local_328[0].denominator_);
    local_328[0].numerator_ = local_328[0].numerator_ / (int)uVar3;
    local_328[0].denominator_ = local_328[0].denominator_ / (int)uVar3;
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    if ((local_328[0].numerator_ != 0) || (local_328[0].denominator_ != uVar3)) {
      __assert_fail("a == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x14f,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0] = (Fraction)((ulong)(uint)(-5 / (int)uVar3) | 2 / (long)(int)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(2,5);
    uVar2 = (-2 / (int)uVar3) * local_328[0].numerator_;
    local_328[0].denominator_ = (int)(5 / (long)(int)uVar3) * local_328[0].denominator_;
    if (local_328[0].denominator_ < 0) {
      uVar2 = -uVar2;
      local_328[0].denominator_ = -local_328[0].denominator_;
    }
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    local_328[0].numerator_ = uVar2;
    uVar3 = std::__detail::__gcd<unsigned_int>(uVar3,local_328[0].denominator_);
    local_328[0].numerator_ = local_328[0].numerator_ / (int)uVar3;
    local_328[0].denominator_ = local_328[0].denominator_ / (int)uVar3;
    uVar2 = std::__detail::__gcd<unsigned_int>(1,1);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if ((local_328[0].numerator_ != uVar3) || (local_328[0].denominator_ != uVar3)) {
      __assert_fail("a == Fraction(1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x153,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    local_328[0] = (Fraction)((ulong)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(2,5);
    local_1a8[0].numerator_ = (int)(2 / (long)(int)uVar3);
    local_1a8[0].denominator_ = (int)(5 / (long)(int)uVar3);
    operator/=(local_328,local_1a8);
    uVar2 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if ((local_328[0].numerator_ != 0) || (local_328[0].denominator_ != uVar3)) {
      __assert_fail("a == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x157,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    local_328[0] = (Fraction)((ulong)(uint)(-5 / (int)uVar3) | 2 / (long)(int)uVar3 << 0x20);
    uVar3 = std::__detail::__gcd<unsigned_int>(2,5);
    local_1a8[0].numerator_ = (int)(2 / (long)(int)uVar3);
    local_1a8[0].denominator_ = (int)(5 / (long)(int)uVar3);
    operator/=(local_328,local_1a8);
    uVar3 = std::__detail::__gcd<unsigned_int>(0x19,4);
    if ((local_328[0].numerator_ != -0x19 / (int)uVar3) ||
       (local_328[0].denominator_ != (uint)(4 / (long)(int)uVar3))) {
      __assert_fail("a == Fraction(-25, 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x15b,"static void Fraction::Test()");
    }
    local_328[0].numerator_ = 0;
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    if (2 < uVar3 + 1) {
      uVar3 = 0;
    }
    if ((int)uVar3 < 0) {
      uVar3 = 1;
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(uVar3,uVar3);
    uVar5 = std::__detail::__gcd<unsigned_int>(1,1);
    uVar2 = 0;
    if (uVar5 + 1 < 3) {
      uVar2 = uVar5;
    }
    if ((int)uVar3 / (int)uVar4 != uVar2) {
      __assert_fail("a == Fraction(1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x161,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = (uint)(2 / (long)(int)uVar3);
    uVar3 = uVar2 * 5 + -5 / (int)uVar3;
    if ((int)uVar2 < 0) {
      uVar3 = -uVar3;
      uVar2 = -uVar2;
      local_328[0].denominator_ = uVar2;
    }
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(uVar4,uVar2);
    local_328[0].numerator_ = (int)uVar3 / (int)uVar4;
    uVar5 = std::__detail::__gcd<unsigned_int>(5,2);
    if (((int)uVar3 / (int)uVar4 != (int)(5 / (long)(int)uVar5)) ||
       ((int)uVar2 / (int)uVar4 != (int)(2 / (long)(int)uVar5))) {
      __assert_fail("a == Fraction(5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x165,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar2 = -5 / (int)uVar3;
    uVar4 = (uint)(2 / (long)(int)uVar3);
    uVar3 = -uVar4;
    if (0 < (int)uVar4) {
      uVar3 = uVar4;
    }
    uVar5 = uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = -uVar2;
    }
    uVar9 = -uVar2;
    if (-1 < (int)uVar4) {
      uVar9 = uVar2;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(uVar5,uVar3);
    uVar4 = std::__detail::__gcd<unsigned_int>(5,2);
    if (((int)uVar9 / (int)uVar2 != -5 / (int)uVar4) ||
       ((int)uVar3 / (int)uVar2 != (int)(2 / (long)(int)uVar4))) {
      __assert_fail("a == Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x169,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(3,7);
    uVar2 = (uint)(7 / (long)(int)uVar3);
    uVar4 = uVar2 * -0x19 + (int)(3 / (long)(int)uVar3);
    uVar3 = -uVar2;
    if (0 < (int)uVar2) {
      uVar3 = uVar2;
    }
    uVar5 = uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = -uVar4;
    }
    uVar9 = -uVar4;
    if (-1 < (int)uVar2) {
      uVar9 = uVar4;
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(uVar5,uVar3);
    uVar4 = std::__detail::__gcd<unsigned_int>(0xac,7);
    if (((int)uVar9 / (int)uVar2 != -0xac / (int)uVar4) ||
       ((int)uVar3 / (int)uVar2 != (int)(7 / (long)(int)uVar4))) {
      __assert_fail("a == Fraction(-172, 7)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x16d,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
    lVar1 = 2 / (long)(int)uVar3;
    uVar2 = (uint)lVar1;
    local_328[0] = (Fraction)((ulong)(uint)(-5 / (int)uVar3) | lVar1 << 0x20);
    if ((int)uVar2 < 0) {
      local_328[0] = (Fraction)(lVar1 << 0x20);
      uVar2 = -uVar2;
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(0,uVar2);
    uVar5 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar5 + 1 < 3) {
      uVar3 = uVar5;
    }
    if ((int)uVar2 / (int)uVar4 != uVar3) {
      __assert_fail("a == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x171,"static void Fraction::Test()");
    }
    uVar2 = std::__detail::__gcd<unsigned_int>(5,2);
    uVar3 = (-5 / (int)uVar2) * 2;
    uVar5 = (-5 / (int)uVar2) * -2;
    uVar4 = (uint)(2 / (long)(int)uVar2);
    uVar2 = -uVar4;
    if (0 < (int)uVar4) {
      uVar2 = uVar4;
    }
    uVar9 = uVar3;
    if (-1 < (int)uVar4) {
      uVar9 = uVar5;
    }
    if ((int)uVar3 < 0) {
      uVar3 = uVar5;
    }
    uVar4 = std::__detail::__gcd<unsigned_int>(uVar3,uVar2);
    uVar5 = std::__detail::__gcd<unsigned_int>(5,1);
    uVar3 = 0;
    if (uVar5 + 1 < 3) {
      uVar3 = uVar5;
    }
    if (((int)uVar9 / (int)uVar4 != (int)(5 / (long)(int)uVar5)) ||
       ((int)uVar2 / (int)uVar4 != uVar3)) {
      __assert_fail("a == Fraction(5, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x175,"static void Fraction::Test()");
    }
    uVar3 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar7 = (ulong)uVar3;
    if (2 < uVar3 + 1) {
      uVar7 = 0;
    }
    local_328[0] = (Fraction)(uVar7 << 0x20);
    local_1a8[0].numerator_ = 5;
    operator/=(local_328,&local_1a8[0].numerator_);
    uVar2 = std::__detail::__gcd<unsigned_int>(0,1);
    uVar3 = 0;
    if (uVar2 + 1 < 3) {
      uVar3 = uVar2;
    }
    if ((local_328[0].numerator_ == 0) && (local_328[0].denominator_ == uVar3)) {
      uVar3 = std::__detail::__gcd<unsigned_int>(5,2);
      local_328[0] = (Fraction)((ulong)(uint)(-5 / (int)uVar3) | 2 / (long)(int)uVar3 << 0x20);
      local_1a8[0].numerator_ = 2;
      operator/=(local_328,&local_1a8[0].numerator_);
      uVar3 = std::__detail::__gcd<unsigned_int>(5,4);
      if ((local_328[0].numerator_ == -5 / (int)uVar3) &&
         (local_328[0].denominator_ == (int)(4 / (long)(int)uVar3))) {
        return;
      }
      __assert_fail("a == Fraction(-5, 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x17d,"static void Fraction::Test()");
    }
    __assert_fail("a == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x179,"static void Fraction::Test()");
  }
LAB_00109608:
  __assert_fail("out.str() == output",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                ,0x109,"static void Fraction::Test()");
}

Assistant:

void Fraction::Test() {
  {//Test Case 1
    const double eps = 1e-9;
    assert(fabs(Fraction(0, 1).ToDouble() - (double) 0) < eps);
    assert(fabs(Fraction(2, 3).ToDouble() - (double) 2 / 3) < eps);
    assert(fabs(Fraction(-7, 3).ToDouble() - (double) (-7) / 3) < eps);
    assert(fabs(Fraction(5, -9).ToDouble() - (double) (-5) / 9) < eps);
    assert(fabs(Fraction(-3, -11).ToDouble() - (double) 3 / 11) < eps);
  }
  {//Test Case 2
    int n = 6;
    std::string input = "6/3 0/6 4/6 -7/3 5/-9 -3/-11";
    std::string output = "2 0 2/3 -7/3 -5/9 3/11 ";

    std::istringstream in(input);
    std::ostringstream out;
    for (int i = 0; i < n; i++) {
      Fraction f;
      in >> f;
      out << f << " ";
    }

    assert(out.str() == output);
  }
  //Test Case 3
  {
    //TODO
  }
  {//Test Case 4
    assert(Fraction(0, 1) + Fraction(1, 3) == Fraction(1, 3));
    assert(Fraction(-5, 2) + Fraction(6, 5) == Fraction(-13, 10));
    assert(Fraction(-5, 2) - Fraction(0, 1) == Fraction(-5, 2));
    assert(Fraction(3, 7) - Fraction(-6, 25) == Fraction(117, 175));
    assert(Fraction(-5, 2) * Fraction(0, 5) == Fraction(0, 1));
    assert(Fraction(-5, 2) * Fraction(-2, 5) == Fraction(1, 1));
    assert(Fraction(0, 1) / Fraction(2, 5) == Fraction(0, 1));
    assert(Fraction(-5, 2) / Fraction(2, 5) == Fraction(-25, 4));
  }
  {//Test Case 5
    assert(Fraction(1, 3) == Fraction(1, 3));
    assert(Fraction(4, 2) == Fraction(2, 1));
    assert(Fraction(-5, 2) != Fraction(6, 5));
    assert(Fraction(5, 2) != Fraction(11, 4));
    assert(Fraction(-5, 2) < Fraction(0, 1));
    assert(Fraction(3, 5) < Fraction(2, 3));
    assert(Fraction(3, 7) > Fraction(-6, 25));
    assert(Fraction(5, 2) > Fraction(0, 1));
    assert(Fraction(-1, 2) <= Fraction(0, 1));
    assert(Fraction(-1, 2) <= Fraction(-4, 8));
    assert(Fraction(-2, 5) >= Fraction(-5, 2));
    assert(Fraction(-10, 4) >= Fraction(-5, 2));
  }
  {//Test Case 6
    assert(Fraction(0, 1) + 1 == Fraction(1, 1));
    assert(Fraction(-5, 2) + 5 == Fraction(5, 2));
    assert(Fraction(-5, 2) - 0 == Fraction(-5, 2));
    assert(Fraction(3, 7) - 25 == Fraction(-172, 7));
    assert(Fraction(-5, 2) * 0 == Fraction(0, 1));
    assert(Fraction(-5, 2) * (-2) == Fraction(5, 1));
    assert(Fraction(0, 1) / 5 == Fraction(0, 1));
    assert(Fraction(-5, 2) / 2 == Fraction(-5, 4));
  }
  {//Test Case 7
    assert(3 + Fraction(0, 1) == Fraction(3, 1));
    assert(6 + Fraction(-5, 2) == Fraction(7, 2));
    assert(1 - Fraction(-5, 2) == Fraction(7, 2));
    assert(25 - Fraction(3, 7) == Fraction(172, 7));
    assert(5 * Fraction(-5, 2) == Fraction(-25, 2));
    assert((-5) * Fraction(-5, 2) == Fraction(25, 2));
    assert(2 / Fraction(1, 1) == Fraction(2, 1));
    assert(2 / Fraction(-5, 2) == Fraction(-4, 5));
  }
  {//Test Case 8
    Fraction a;
    a = Fraction(0, 1);
    a += Fraction(1, 3);
    assert(a == Fraction(1, 3));

    a = Fraction(-5, 2);
    a += Fraction(6, 5);
    assert(a == Fraction(-13, 10));

    a = Fraction(-5, 2);
    a -= Fraction(0, 1);
    assert(a == Fraction(-5, 2));

    a = Fraction(3, 7);
    a -= Fraction(-6, 25);
    assert(a == Fraction(117, 175));

    a = Fraction(-5, 2);
    a *= Fraction(0, 5);
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a *= Fraction(-2, 5);
    assert(a == Fraction(1, 1));

    a = Fraction(0, 1);
    a /= Fraction(2, 5);
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a /= Fraction(2, 5);
    assert(a == Fraction(-25, 4));
  }

  {//Test Case 9
    Fraction a = Fraction(0, 1);
    a += 1;
    assert(a == Fraction(1, 1));

    a = Fraction(-5, 2);
    a += 5;
    assert(a == Fraction(5, 2));

    a = Fraction(-5, 2);
    a -= 0;
    assert(a == Fraction(-5, 2));

    a = Fraction(3, 7);
    a -= 25;
    assert(a == Fraction(-172, 7));

    a = Fraction(-5, 2);
    a *= 0;
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a *= (-2);
    assert(a == Fraction(5, 1));

    a = Fraction(0, 1);
    a /= 5;
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a /= 2;
    assert(a == Fraction(-5, 4));
  }
}